

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-htable.c
# Opt level: O3

void test_lookup(void)

{
  int iVar1;
  HTABLE_NODE *pHVar2;
  ulong uVar3;
  uint uVar4;
  char key [8];
  HTABLE htable;
  VAL val_key;
  char local_70 [8];
  HTABLE local_68;
  HTABLE_NODE local_48;
  char *local_40;
  
  local_68.planes = (void **)0x0;
  local_68.n_planes = 0;
  local_68._12_4_ = 0;
  local_68.n = 0;
  uVar3 = 0;
  do {
    snprintf(local_70,8,"%d",uVar3);
    pHVar2 = make_val(local_70,(int)uVar3);
    iVar1 = htable_insert(&local_68,pHVar2,cmp_func,hash_func);
    acutest_check_((uint)(iVar1 == 0),
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-htable.c"
                   ,0x86,"%s","htable_insert(&htable, make_val(key, i), cmp_func, hash_func) == 0");
    uVar4 = (int)uVar3 + 1;
    uVar3 = (ulong)uVar4;
  } while (uVar4 != 100000);
  uVar3 = 0;
  do {
    local_40 = local_70;
    snprintf(local_70,8,"%d",uVar3);
    pHVar2 = htable_lookup(&local_68,&local_48,cmp_func,hash_func);
    acutest_check_((uint)(pHVar2 != (HTABLE_NODE *)0x0),
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-htable.c"
                   ,0x90,"%s","node != NULL");
    acutest_check_((uint)((int)uVar3 == *(int *)&pHVar2[2].next),
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-htable.c"
                   ,0x91,"%s","HTABLE_DATA(node, VAL, the_node)->payload == i");
    uVar4 = (int)uVar3 + 1;
    uVar3 = (ulong)uVar4;
  } while (uVar4 != 100000);
  builtin_strncpy(local_70,"n/a",4);
  local_40 = local_70;
  pHVar2 = htable_lookup(&local_68,&local_48,cmp_func,hash_func);
  acutest_check_((uint)(pHVar2 == (HTABLE_NODE *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-htable.c"
                 ,0x96,"%s","htable_lookup(&htable, &val_key.the_node, cmp_func, hash_func) == NULL"
                );
  htable_fini(&local_68,dtor_func);
  return;
}

Assistant:

static void
test_lookup(void)
{
    HTABLE htable = HTABLE_INITIALIZER;
    VAL val_key;
    char key[8];
    int i;

    for(i = 0; i < 100000; i++) {
        snprintf(key, 8, "%d", i);
        TEST_CHECK(htable_insert(&htable, make_val(key, i), cmp_func, hash_func) == 0);
    }

    for(i = 0; i < 100000; i++) {
        HTABLE_NODE* node;

        val_key.key = key;
        snprintf(val_key.key, 8, "%d", i);

        node = htable_lookup(&htable, &val_key.the_node, cmp_func, hash_func);
        TEST_CHECK(node != NULL);
        TEST_CHECK(HTABLE_DATA(node, VAL, the_node)->payload == i);
    }

    val_key.key = key;
    snprintf(val_key.key, 8, "n/a");
    TEST_CHECK(htable_lookup(&htable, &val_key.the_node, cmp_func, hash_func) == NULL);

    htable_fini(&htable, dtor_func);
}